

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::
treeBase<char,_int,_ft::pair<const_char,_int>,_ft::less<char>,_ft::allocator<ft::pair<const_char,_int>_>_>
::fixEraseViolation(treeBase<char,_int,_ft::pair<const_char,_int>,_ft::less<char>,_ft::allocator<ft::pair<const_char,_int>_>_>
                    *this,node *x)

{
  treeNode<ft::pair<const_char,_int>_> *ptVar1;
  treeNode<ft::pair<const_char,_int>_> *ptVar2;
  treeNode<ft::pair<const_char,_int>_> *x_00;
  
LAB_0010e3ae:
  do {
    do {
      if ((x == (this->m_tree).m_root) || (x->colour != BLACK)) {
        x->colour = BLACK;
        return;
      }
      x_00 = x->parent;
      ptVar1 = x_00->left;
      ptVar2 = x_00->right;
      if (x == ptVar1) {
        if (ptVar2->colour == RED) {
          ptVar2->colour = BLACK;
          x_00->colour = RED;
          rotateLeft(this,x_00);
          x_00 = x->parent;
          ptVar2 = x_00->right;
        }
        ptVar1 = ptVar2->right;
        if (ptVar2->left->colour == BLACK) {
          if (ptVar1->colour == BLACK) {
            ptVar2->colour = RED;
            x = x_00;
            goto LAB_0010e3ae;
          }
        }
        else if (ptVar1->colour == BLACK) {
          ptVar2->left->colour = BLACK;
          ptVar2->colour = RED;
          rotateRight(this,ptVar2);
          x_00 = x->parent;
          ptVar2 = x_00->right;
          ptVar1 = ptVar2->right;
        }
        ptVar2->colour = x_00->colour;
        x_00->colour = BLACK;
        ptVar1->colour = BLACK;
        rotateLeft(this,x_00);
        x = (this->m_tree).m_root;
        goto LAB_0010e3ae;
      }
    } while (x != ptVar2);
    if (ptVar1->colour == RED) {
      ptVar1->colour = BLACK;
      x_00->colour = RED;
      rotateRight(this,x_00);
      x_00 = x->parent;
      ptVar1 = x_00->left;
    }
    ptVar2 = ptVar1->left;
    if (ptVar1->right->colour == BLACK) {
      if (ptVar2->colour == BLACK) {
        ptVar1->colour = RED;
        x = x_00;
        goto LAB_0010e3ae;
      }
    }
    else if (ptVar2->colour == BLACK) {
      ptVar1->right->colour = BLACK;
      ptVar1->colour = RED;
      rotateLeft(this,ptVar1);
      x_00 = x->parent;
      ptVar1 = x_00->left;
      ptVar2 = ptVar1->left;
    }
    ptVar1->colour = x_00->colour;
    x_00->colour = BLACK;
    ptVar2->colour = BLACK;
    rotateRight(this,x_00);
    x = (this->m_tree).m_root;
  } while( true );
}

Assistant:

void	fixEraseViolation(node* x)
	{
		while (x != this->root() && x->colour == BLACK)
		{
			if (x == x->parent->left)
			{
				node*	w = x->parent->right;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateLeft(x->parent);
					w = x->parent->right;
				}
				if (w->left->colour == BLACK && w->right->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->right->colour == BLACK)
					{
						w->left->colour = BLACK;
						w->colour = RED;
						this->rotateRight(w);
						w = x->parent->right;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->right->colour = BLACK;
					this->rotateLeft(x->parent);
					x = this->root();
				}
			}
			else if (x == x->parent->right)
			{
				node*	w = x->parent->left;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateRight(x->parent);
					w = x->parent->left;
				}
				if (w->right->colour == BLACK && w->left->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->left->colour == BLACK)
					{
						w->right->colour = BLACK;
						w->colour = RED;
						this->rotateLeft(w);
						w = x->parent->left;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->left->colour = BLACK;
					this->rotateRight(x->parent);
					x = this->root();
				}
			}
		}
		x->colour = BLACK;
	}